

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddhcal.cpp
# Opt level: O0

int __thiscall
icu_63::BuddhistCalendar::clone
          (BuddhistCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BuddhistCalendar *this_00;
  undefined8 local_30;
  BuddhistCalendar *this_local;
  
  this_00 = (BuddhistCalendar *)UMemory::operator_new((UMemory *)0x290,(size_t)__fn);
  local_30 = (BuddhistCalendar *)0x0;
  if (this_00 != (BuddhistCalendar *)0x0) {
    BuddhistCalendar(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Calendar* BuddhistCalendar::clone(void) const
{
    return new BuddhistCalendar(*this);
}